

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O2

void __thiscall cppcms::http::response::response(response *this,context *context)

{
  _data *this_00;
  connection *c;
  service *psVar1;
  cached_settings *pcVar2;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  this_00 = (_data *)operator_new(0x530);
  c = http::context::connection(context);
  _data::_data(this_00,c);
  (this->d).ptr_ = this_00;
  this->context_ = context;
  this->stream_ = (ostream *)0x0;
  this->io_mode_ = asynchronous;
  this->field_0x1c = this->field_0x1c & 0xf0;
  std::__cxx11::string::string((string *)&local_58,"text/html",(allocator *)&local_38);
  set_content_header(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  psVar1 = http::context::service(this->context_);
  pcVar2 = service::cached_settings(psVar1);
  if ((pcVar2->service).disable_xpowered_by == false) {
    psVar1 = http::context::service(this->context_);
    pcVar2 = service::cached_settings(psVar1);
    if ((pcVar2->service).disable_xpowered_by_version == true) {
      std::__cxx11::string::string((string *)&local_58,"X-Powered-By",&local_59);
      std::__cxx11::string::string((string *)&local_38,"CppCMS",&local_5a);
      set_header(this,&local_58,&local_38);
    }
    else {
      std::__cxx11::string::string((string *)&local_58,"X-Powered-By",&local_59);
      std::__cxx11::string::string((string *)&local_38,"CppCMS/2.0.0.beta2",&local_5a);
      set_header(this,&local_58,&local_38);
    }
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

response::response(context &context) :
	d(new _data(&context.connection())),
	context_(context),
	stream_(0),
	io_mode_(asynchronous),
	disable_compression_(0),
	ostream_requested_(0),
	copy_to_cache_(0),
	finalized_(0)
{
	set_content_header("text/html");
	if(context_.service().cached_settings().service.disable_xpowered_by==false) {
		if(context_.service().cached_settings().service.disable_xpowered_by_version)
			set_header("X-Powered-By", CPPCMS_PACKAGE_NAME);
		else
			set_header("X-Powered-By", CPPCMS_PACKAGE_NAME "/" CPPCMS_PACKAGE_VERSION);
	}
}